

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall
LowererMD::ChangeToHelperCall
          (LowererMD *this,Instr *callInstr,JnHelperMethod helperMethod,LabelInstr *labelBailOut,
          Opnd *opndBailOutArg,PropertySymOpnd *propSymOpnd,bool isHelperContinuation)

{
  uint32 bailOutOffset;
  code *pcVar1;
  JnHelperMethod helperMethod_00;
  Instr *instr;
  bool bVar2;
  int helperArgCount;
  BailOutKind BVar3;
  uint uVar4;
  uint functionId;
  ThreadContextInfo *context;
  Var address;
  AddrOpnd *opndArg;
  undefined4 *puVar5;
  BailOutInfo *pBVar6;
  Allocator *pAVar7;
  BailOutRecord *this_00;
  OpCode OVar8;
  BailOutInfo *local_c8;
  TrackAllocData local_a8;
  BailOutRecord *local_80;
  BailOutRecord *bailOutRecord;
  BailOutInfo *bailOutInfoCopy;
  Instr *pIStack_68;
  OpCode opcode;
  Instr *instrRet;
  HelperCallOpnd *helperCallOpnd;
  Instr *pIStack_50;
  BailOutKind bailOutKind;
  Instr *bailOutInstr;
  BailOutInfo *bailOutInfo;
  bool hasLazyBailOut;
  PropertySymOpnd *pPStack_38;
  bool isHelperContinuation_local;
  PropertySymOpnd *propSymOpnd_local;
  Opnd *opndBailOutArg_local;
  LabelInstr *labelBailOut_local;
  Instr *pIStack_18;
  JnHelperMethod helperMethod_local;
  Instr *callInstr_local;
  LowererMD *this_local;
  
  bailOutInfo._7_1_ = isHelperContinuation;
  pPStack_38 = propSymOpnd;
  propSymOpnd_local = (PropertySymOpnd *)opndBailOutArg;
  opndBailOutArg_local = (Opnd *)labelBailOut;
  labelBailOut_local._4_4_ = helperMethod;
  pIStack_18 = callInstr;
  callInstr_local = (Instr *)this;
  bVar2 = IR::Instr::HasLazyBailOut(callInstr);
  if ((bVar2) && (bVar2 = HelperMethodAttributes::CanBeReentrant(labelBailOut_local._4_4_), !bVar2))
  {
    IR::Instr::ClearLazyBailOut(pIStack_18);
  }
  bVar2 = IR::Instr::HasLazyBailOut(pIStack_18);
  if ((bVar2) && (bVar2 = IR::Instr::HasPreOpBailOut(pIStack_18), bVar2)) {
    BVar3 = IR::Instr::GetBailOutKind(pIStack_18);
    bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x2c0,"(false)","Not implemented");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  bailOutInfo._6_1_ = IR::Instr::HasLazyBailOut(pIStack_18);
  bVar2 = IR::Instr::HasBailOutInfo(pIStack_18);
  if (bVar2) {
    local_c8 = IR::Instr::GetBailOutInfo(pIStack_18);
  }
  else {
    local_c8 = (BailOutInfo *)0x0;
  }
  bailOutInstr = (Instr *)local_c8;
  Lowerer::ReconcileWithLowererStateOnHelperCall
            (this->m_lowerer,pIStack_18,labelBailOut_local._4_4_);
  pIStack_50 = pIStack_18;
  bVar2 = IR::Instr::HasBailOutInfo(pIStack_18);
  if (bVar2) {
    helperCallOpnd._4_4_ = IR::Instr::GetBailOutKind(pIStack_18);
    if ((helperCallOpnd._4_4_ == BailOutOnNotPrimitive) ||
       (helperCallOpnd._4_4_ == BailOutOnPowIntIntOverflow)) {
      pIStack_18 = IR::Instr::New(pIStack_18->m_opcode,pIStack_18->m_func);
      IR::Instr::TransferTo(pIStack_50,pIStack_18);
      IR::Instr::InsertBefore(pIStack_50,pIStack_18);
      OVar8 = BailOnPowIntIntOverflow;
      if (helperCallOpnd._4_4_ == BailOutOnNotPrimitive) {
        OVar8 = BailOnNotPrimitive;
      }
      pIStack_50->m_opcode = OVar8;
      IR::Instr::SetSrc1(pIStack_50,(Opnd *)propSymOpnd_local);
    }
    else {
      bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(helperCallOpnd._4_4_);
      if (bVar2) {
        pIStack_50 = Lowerer::SplitBailOnImplicitCall(this->m_lowerer,&stack0xffffffffffffffe8);
      }
      else {
        bVar2 = BailOutInfo::HasLazyBailOut(helperCallOpnd._4_4_);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x2e2,"(BailOutInfo::HasLazyBailOut(bailOutKind))",
                             "Unexpected BailOutKind, are we adding new BailOutKind on instructions?"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
  }
  helperMethod_00 = labelBailOut_local._4_4_;
  pIStack_18->m_opcode = CALL;
  helperArgCount = LowererMDArch::GetHelperArgsCount(&this->lowererMDArch);
  instrRet = (Instr *)Lowerer::CreateHelperCallOpnd(helperMethod_00,helperArgCount,this->m_func);
  bVar2 = IR::HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)instrRet);
  instr = pIStack_18;
  if (bVar2) {
    context = Func::GetThreadContextInfo(this->m_func);
    address = (Var)IR::GetMethodOriginalAddress(context,labelBailOut_local._4_4_);
    opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
    LoadHelperArgument(this,instr,&opndArg->super_Opnd);
    Lowerer::LoadScriptContext(this->m_lowerer,pIStack_18);
  }
  IR::Instr::SetSrc1(pIStack_18,(Opnd *)instrRet);
  pIStack_68 = LowererMDArch::LowerCall(&this->lowererMDArch,pIStack_18,0);
  if (pIStack_50 != pIStack_18) {
    bailOutInfoCopy._6_2_ = pIStack_50->m_opcode;
    if ((bailOutInfoCopy._6_2_ == BailOnNotPrimitive) ||
       (bailOutInfoCopy._6_2_ == BailOnPowIntIntOverflow)) {
      Lowerer::LowerBailOnTrue(this->m_lowerer,pIStack_50,(LabelInstr *)opndBailOutArg_local);
    }
    else if (bailOutInfoCopy._6_2_ == BailOnNotEqual) {
      BVar3 = IR::Instr::GetBailOutKind(pIStack_50);
      bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x300,
                           "(BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind()))"
                           ,"BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind())")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      Lowerer::LowerBailOnEqualOrNotEqual
                (this->m_lowerer,pIStack_50,(BranchInstr *)0x0,(LabelInstr *)opndBailOutArg_local,
                 pPStack_38,(bool)(bailOutInfo._7_1_ & 1));
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x305,"(false)","Unexpected OpCode for BailOutInstruction");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((bailOutInfo._6_1_ & 1) != 0) {
      if (bailOutInstr == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x319,"(bailOutInfo != nullptr)","bailOutInfo != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = IR::Instr::HasBailOutInfo(pIStack_18);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x31a,"(!callInstr->HasBailOutInfo())","!callInstr->HasBailOutInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pIStack_18->m_opcode != CALL) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x31b,"(callInstr->m_opcode == Js::OpCode::CALL)",
                           "callInstr->m_opcode == Js::OpCode::CALL");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pIStack_18 = IR::Instr::ConvertToBailOutInstrWithBailOutInfoCopy
                             (pIStack_18,(BailOutInfo *)bailOutInstr,LazyBailOut);
      bVar2 = IR::Instr::HasBailOutInfo(pIStack_18);
      if ((!bVar2) ||
         (pBVar6 = IR::Instr::GetBailOutInfo(pIStack_18), pBVar6 == (BailOutInfo *)bailOutInstr)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,799,
                           "(callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo)"
                           ,
                           "callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bailOutRecord = (BailOutRecord *)IR::Instr::GetBailOutInfo(pIStack_18);
      pAVar7 = Func::GetNativeCodeDataAllocator(this->m_func);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a8,(type_info *)&BailOutRecord::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                 ,0x32a);
      pAVar7 = NativeCodeData::Allocator::TrackAllocInfo(pAVar7,&local_a8);
      this_00 = (BailOutRecord *)
                new<NativeCodeData::AllocatorT<BailOutRecord>>
                          (0x60,(AllocatorT<BailOutRecord> *)pAVar7,0x775940);
      bailOutOffset = *(uint32 *)((long)&bailOutRecord->argOutOffsetInfo + 4);
      uVar4 = bailOutRecord->localOffsetsCount;
      BVar3 = IR::Instr::GetBailOutKind(pIStack_18);
      BailOutRecord::BailOutRecord
                (this_00,bailOutOffset,uVar4,BVar3,*(Func **)&bailOutRecord[1].actualCount);
      this_00->bailOutOpcode = (OpCode)bailOutRecord[1].polymorphicCacheIndex;
      bailOutRecord->parent = this_00;
      local_80 = this_00;
    }
  }
  uVar4 = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eb5b30,AsmjsCallDebugBreakPhase,uVar4,functionId);
  if (bVar2) {
    GenerateDebugBreak(pIStack_68->m_next);
  }
  return pIStack_68;
}

Assistant:

IR::Instr *
LowererMD::ChangeToHelperCall(IR::Instr *callInstr, IR::JnHelperMethod helperMethod, IR::LabelInstr *labelBailOut,
                              IR::Opnd *opndBailOutArg, IR::PropertySymOpnd *propSymOpnd, bool isHelperContinuation)
{
    // Clear lazy bailout when we realize that the function cannot be reentrant in lowerer
    // since they won't have side effects
    if (callInstr->HasLazyBailOut() && !HelperMethodAttributes::CanBeReentrant(helperMethod))
    {
        callInstr->ClearLazyBailOut();
    }

    // If we want a LazyBailOut on an instruction with preop bailout, we
    // would need to have a BailOnImplicitCallPreOp on that instruction.
    // There are two ways we can go about this:
    // 1. During GlobOpt::GenerateLazyBailOut, simply use BailOnImplicitCallPreOp
    //    as the main bailout kind for that instruction. This wouldn't require
    //    any special treatment in the lowerer. However, there are a few problems:
    //      a) The instruction might have some other main bailout kind already
    //         attached.
    //         + First scenario is that the bailout kind already prevents
    //         implicit calls from happening, which leaves us to just correctly
    //         implement GlobOpt::IsLazyBailOutCurrentlyNeeded so that it doesn't
    //         return true when we already have such bailouts by incorporating
    //         GlobOpt::MayNeedBailOnImplicitCall.
    //         + Second scenario is when that bailout kind doesn't really help with
    //         preventing implicit calls. Theoretically, this shouldn't be a problem
    //         because we should be able to support bail on implicit calls if that
    //         instruction might have implicit calls. But there are some dark patterns
    //         such as NewScObjArray having a BailOnNotNative attached to it.
    //         Those will need to be rewritten before we proceed.
    // 
    //      b) We will have to change our BailOutKind bit validation because some of the
    //         kinds don't currently expect to go together with BailOnImplicitCall. This
    //         is probably less of a problem and more of just finding those cases and
    //         adding allowed bit combinations.
    //
    // 2. Just attach the lazy bailout bit onto the BailOutKind and use this opportunity
    //    to also lower an additional BailOnImplicitCallPreOp. The problem is we aren't
    //    sure if those instructions will go through `ChangeToHelperCall` at all since
    //    this right now only handles BailOutOnNotPrimitive, BailOutOnPowIntIntOverflow,
    //    and BailOutOnImplicitCalls.
    if (callInstr->HasLazyBailOut() && callInstr->HasPreOpBailOut() &&
        !BailOutInfo::IsBailOutOnImplicitCalls(callInstr->GetBailOutKind()))
    {
        AssertMsg(false, "Not implemented");
    }

    const bool hasLazyBailOut = callInstr->HasLazyBailOut();

    // Cache BailOutInfo so that we can copy it later for lazy bailout
    BailOutInfo * const bailOutInfo = callInstr->HasBailOutInfo() ? callInstr->GetBailOutInfo() : nullptr;

#if DBG
    this->m_lowerer->ReconcileWithLowererStateOnHelperCall(callInstr, helperMethod);
#endif
    IR::Instr * bailOutInstr = callInstr;
    if (callInstr->HasBailOutInfo())
    {
        const IR::BailOutKind bailOutKind = callInstr->GetBailOutKind();

        if (bailOutKind == IR::BailOutOnNotPrimitive ||
            bailOutKind == IR::BailOutOnPowIntIntOverflow)
        {
            callInstr = IR::Instr::New(callInstr->m_opcode, callInstr->m_func);
            bailOutInstr->TransferTo(callInstr);
            bailOutInstr->InsertBefore(callInstr);

            bailOutInstr->m_opcode = bailOutKind == IR::BailOutOnNotPrimitive
                                        ? Js::OpCode::BailOnNotPrimitive
                                        : Js::OpCode::BailOnPowIntIntOverflow;
            bailOutInstr->SetSrc1(opndBailOutArg);
        }
        else if (BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
        {
            bailOutInstr = this->m_lowerer->SplitBailOnImplicitCall(callInstr);
        }
        else
        {
            AssertMsg(BailOutInfo::HasLazyBailOut(bailOutKind), "Unexpected BailOutKind, are we adding new BailOutKind on instructions?");
        }
    }

    callInstr->m_opcode = Js::OpCode::CALL;

    IR::HelperCallOpnd *helperCallOpnd = Lowerer::CreateHelperCallOpnd(helperMethod, this->lowererMDArch.GetHelperArgsCount(), m_func);
    if (helperCallOpnd->IsDiagHelperCallOpnd())
    {
        // Load arguments for the wrapper.
        this->LoadHelperArgument(callInstr, IR::AddrOpnd::New((Js::Var)IR::GetMethodOriginalAddress(m_func->GetThreadContextInfo(), helperMethod), IR::AddrOpndKindDynamicMisc, m_func));
        this->m_lowerer->LoadScriptContext(callInstr);
    }
    callInstr->SetSrc1(helperCallOpnd);

    IR::Instr * instrRet = this->lowererMDArch.LowerCall(callInstr, 0);

    if (bailOutInstr != callInstr)
    {
        const Js::OpCode opcode = bailOutInstr->m_opcode;
        // The bailout needs to be lowered after we lower the helper call because the helper argument
        // has already been loaded. We need to drain them on AMD64 before starting another helper call
        if (opcode == Js::OpCode::BailOnNotPrimitive ||
            opcode == Js::OpCode::BailOnPowIntIntOverflow)
        {
            this->m_lowerer->LowerBailOnTrue(bailOutInstr, labelBailOut);
        }
        else if (opcode == Js::OpCode::BailOnNotEqual)
        {
            // `SplitBailOnImplicitCall` above changes the opcode to BailOnNotEqual
            Assert(BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind()));
            this->m_lowerer->LowerBailOnEqualOrNotEqual(bailOutInstr, nullptr, labelBailOut, propSymOpnd, isHelperContinuation);
        }
        else
        {
            AssertMsg(false, "Unexpected OpCode for BailOutInstruction");
        }

        // Create BailOutInfo and BailOutRecord for helper call
        // Example:
        // We transform:
        // ```
        //  call someHelper
        //  ...
        //  call SaveAllRegisterAndBailOut (BailOutReason)
        // ```
        // to
        // ```
        //  call someHelper (LazyBailOut)
        //  ...
        //  call SaveAllRegisterAndBailOut (BailOutReason)
        // ```
        // so that the call to helper has the correct BailOutRecord filled during RegAlloc.
        if (hasLazyBailOut)
        {
            Assert(bailOutInfo != nullptr);
            Assert(!callInstr->HasBailOutInfo());
            Assert(callInstr->m_opcode == Js::OpCode::CALL);

            callInstr = callInstr->ConvertToBailOutInstrWithBailOutInfoCopy(bailOutInfo, IR::LazyBailOut);

            Assert(callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo);

            BailOutInfo *bailOutInfoCopy = callInstr->GetBailOutInfo();

            BailOutRecord *bailOutRecord = NativeCodeDataNewZ(
                this->m_func->GetNativeCodeDataAllocator(),
                BailOutRecord,
                bailOutInfoCopy->bailOutOffset,
                bailOutInfoCopy->polymorphicCacheIndex,
                callInstr->GetBailOutKind(),
                bailOutInfoCopy->bailOutFunc
            );

#if ENABLE_DEBUG_CONFIG_OPTIONS
            bailOutRecord->bailOutOpcode = bailOutInfoCopy->bailOutOpcode;
#endif

            bailOutInfoCopy->bailOutRecord = bailOutRecord;
        }
    }

#if DBG
    if (PHASE_ON(Js::AsmjsCallDebugBreakPhase, this->m_func))
    {
        this->GenerateDebugBreak(instrRet->m_next);
    }
#endif

    return instrRet;
}